

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall Assimp::ASE::Parser::ParseLV3PosAnimationBlock(Parser *this,Animation *anim)

{
  bool bVar1;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> *this_00;
  reference pvVar2;
  aiVectorKey *key;
  byte local_21;
  uint local_20;
  int iStack_1c;
  bool b;
  uint iIndex;
  int iDepth;
  Animation *anim_local;
  Parser *this_local;
  
  iStack_1c = 0;
  _iIndex = anim;
  anim_local = (Animation *)this;
  do {
    if (*this->filePtr == '*') {
      this->filePtr = this->filePtr + 1;
      local_21 = 0;
      bVar1 = TokenMatch<char_const>(&this->filePtr,"CONTROL_POS_SAMPLE",0x12);
      if (bVar1) {
        local_21 = 1;
        _iIndex->mPositionType = TRACK;
      }
      bVar1 = TokenMatch<char_const>(&this->filePtr,"CONTROL_BEZIER_POS_KEY",0x16);
      if (bVar1) {
        local_21 = 1;
        _iIndex->mPositionType = BEZIER;
      }
      bVar1 = TokenMatch<char_const>(&this->filePtr,"CONTROL_TCB_POS_KEY",0x13);
      if (bVar1) {
        local_21 = 1;
        _iIndex->mPositionType = TCB;
      }
      if ((local_21 & 1) != 0) {
        this_00 = &_iIndex->akeyPositions;
        aiVectorKey::aiVectorKey((aiVectorKey *)&key);
        std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::push_back
                  (this_00,(aiVectorKey *)&key);
        pvVar2 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::back
                           (&_iIndex->akeyPositions);
        ParseLV4MeshFloatTriple(this,&(pvVar2->mValue).x,&local_20);
        pvVar2->mTime = (double)local_20;
      }
    }
    if (*this->filePtr == '{') {
      iStack_1c = iStack_1c + 1;
    }
    else if (*this->filePtr == '}') {
      iStack_1c = iStack_1c + -1;
      if (iStack_1c == 0) {
        this->filePtr = this->filePtr + 1;
        SkipToNextToken(this);
        return;
      }
    }
    else if (*this->filePtr == '\0') {
      LogError(this,"Encountered unexpected EOL while parsing a *CONTROL_POS_TRACK chunk (Level 3)")
      ;
    }
    bVar1 = IsLineEnd<char>(*this->filePtr);
    if ((bVar1) && ((this->bLastWasEndLine & 1U) == 0)) {
      this->iLineNumber = this->iLineNumber + 1;
      this->bLastWasEndLine = true;
    }
    else {
      this->bLastWasEndLine = false;
    }
    this->filePtr = this->filePtr + 1;
  } while( true );
}

Assistant:

void Parser::ParseLV3PosAnimationBlock(ASE::Animation& anim)
{
    AI_ASE_PARSER_INIT();
    unsigned int iIndex;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            bool b = false;

            // For the moment we're just reading the three floats -
            // we ignore the additional information for bezier's and TCBs

            // simple scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_POS_SAMPLE" ,18))
            {
                b = true;
                anim.mPositionType = ASE::Animation::TRACK;
            }

            // Bezier scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_BEZIER_POS_KEY" ,22))
            {
                b = true;
                anim.mPositionType = ASE::Animation::BEZIER;
            }
            // TCB scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_TCB_POS_KEY" ,19))
            {
                b = true;
                anim.mPositionType = ASE::Animation::TCB;
            }
            if (b)
            {
                anim.akeyPositions.push_back(aiVectorKey());
                aiVectorKey& key = anim.akeyPositions.back();
                ParseLV4MeshFloatTriple(&key.mValue.x,iIndex);
                key.mTime = (double)iIndex;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*CONTROL_POS_TRACK");
    }
}